

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver.cpp
# Opt level: O0

void __thiscall Clasp::Solver::Dirty::cleanup(Dirty *this,EVP_PKEY_CTX *ctx)

{
  bool bVar1;
  size_type sVar2;
  size_type sVar3;
  reference puVar4;
  reference pDVar5;
  Dirty *in_RDX;
  right_iterator end_1;
  right_iterator it_1;
  ConstraintDB *db;
  WatchList *wl;
  uint32 id;
  left_iterator end;
  left_iterator it;
  uint32 maxId;
  InSet inCons;
  left_right_rep<Clasp::Literal,_unsigned_int> *in_stack_ffffffffffffff18;
  left_right_rep<Clasp::Literal,_unsigned_int> *in_stack_ffffffffffffff20;
  left_right_rep<Clasp::Literal,_unsigned_int> *in_stack_ffffffffffffff28;
  Dirty *in_stack_ffffffffffffff30;
  Dirty *this_00;
  undefined4 in_stack_ffffffffffffff38;
  undefined4 in_stack_ffffffffffffff3c;
  uint uVar6;
  InSet in_stack_ffffffffffffff40;
  undefined7 in_stack_ffffffffffffff48;
  undefined1 uVar7;
  reverse_iterator<Clasp::GenericWatch_*> *in_stack_ffffffffffffff50;
  InSet in_stack_ffffffffffffff58;
  reverse_iterator<unsigned_int_*> local_88;
  left_right_rep<Clasp::Literal,_unsigned_int> *local_80;
  ConstraintSet *local_78;
  ConstraintSet *local_50;
  left_right_rep<Clasp::ClauseWatch,_Clasp::GenericWatch> *local_48;
  uint32 local_3c;
  left_iterator local_38;
  left_iterator local_30;
  size_type local_24;
  ConstraintSet *local_20;
  Dirty *local_18;
  EVP_PKEY_CTX *local_10;
  Dirty *local_8;
  
  local_20 = &this->cons;
  local_18 = in_RDX;
  local_10 = ctx;
  local_8 = this;
  local_24 = bk_lib::
             pod_vector<bk_lib::left_right_sequence<Clasp::ClauseWatch,_Clasp::GenericWatch,_0U>,_std::allocator<bk_lib::left_right_sequence<Clasp::ClauseWatch,_Clasp::GenericWatch,_0U>_>_>
             ::size((pod_vector<bk_lib::left_right_sequence<Clasp::ClauseWatch,_Clasp::GenericWatch,_0U>,_std::allocator<bk_lib::left_right_sequence<Clasp::ClauseWatch,_Clasp::GenericWatch,_0U>_>_>
                     *)ctx);
  local_30 = bk_lib::detail::left_right_rep<Clasp::Literal,_unsigned_int>::left_begin
                       ((left_right_rep<Clasp::Literal,_unsigned_int> *)0x1f2ff6);
  local_38 = bk_lib::detail::left_right_rep<Clasp::Literal,_unsigned_int>::left_end
                       ((left_right_rep<Clasp::Literal,_unsigned_int> *)this);
  for (; local_30 != local_38; local_30 = local_30 + 1) {
    local_3c = Literal::id(local_30);
    if (local_3c < local_24) {
      local_48 = (left_right_rep<Clasp::ClauseWatch,_Clasp::GenericWatch> *)
                 bk_lib::
                 pod_vector<bk_lib::left_right_sequence<Clasp::ClauseWatch,_Clasp::GenericWatch,_0U>,_std::allocator<bk_lib::left_right_sequence<Clasp::ClauseWatch,_Clasp::GenericWatch,_0U>_>_>
                 ::operator[]((pod_vector<bk_lib::left_right_sequence<Clasp::ClauseWatch,_Clasp::GenericWatch,_0U>,_std::allocator<bk_lib::left_right_sequence<Clasp::ClauseWatch,_Clasp::GenericWatch,_0U>_>_>
                               *)local_10,local_3c);
      sVar2 = bk_lib::detail::left_right_rep<Clasp::ClauseWatch,_Clasp::GenericWatch>::left_size
                        (local_48);
      if (sVar2 != 0) {
        bk_lib::detail::left_right_rep<Clasp::ClauseWatch,_Clasp::GenericWatch>::left_begin
                  ((left_right_rep<Clasp::ClauseWatch,_Clasp::GenericWatch> *)0x1f308a);
        bVar1 = test_and_clear<Clasp::ClauseHead>
                          (in_stack_ffffffffffffff30,(ClauseHead **)in_stack_ffffffffffffff28);
        if (bVar1) {
          in_stack_ffffffffffffff58.set = (ConstraintSet *)local_48;
          in_stack_ffffffffffffff50 =
               (reverse_iterator<Clasp::GenericWatch_*> *)
               bk_lib::detail::left_right_rep<Clasp::ClauseWatch,_Clasp::GenericWatch>::left_begin
                         ((left_right_rep<Clasp::ClauseWatch,_Clasp::GenericWatch> *)0x1f30b7);
          bk_lib::detail::left_right_rep<Clasp::ClauseWatch,_Clasp::GenericWatch>::left_end
                    (local_48);
          local_50 = local_20;
          std::remove_if<Clasp::ClauseWatch*,Clasp::(anonymous_namespace)::InSet>
                    ((ClauseWatch *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38),
                     (ClauseWatch *)in_stack_ffffffffffffff30,in_stack_ffffffffffffff40);
          bk_lib::detail::left_right_rep<Clasp::ClauseWatch,_Clasp::GenericWatch>::shrink_left
                    ((left_right_rep<Clasp::ClauseWatch,_Clasp::GenericWatch> *)
                     in_stack_ffffffffffffff30,(left_iterator)in_stack_ffffffffffffff28);
        }
      }
      sVar2 = bk_lib::detail::left_right_rep<Clasp::ClauseWatch,_Clasp::GenericWatch>::right_size
                        (local_48);
      uVar7 = false;
      if (sVar2 != 0) {
        bk_lib::detail::left_right_rep<Clasp::ClauseWatch,_Clasp::GenericWatch>::right_begin
                  ((left_right_rep<Clasp::ClauseWatch,_Clasp::GenericWatch> *)
                   in_stack_ffffffffffffff28);
        std::reverse_iterator<Clasp::GenericWatch_*>::operator->
                  ((reverse_iterator<Clasp::GenericWatch_*> *)in_stack_ffffffffffffff20);
        uVar7 = test_and_clear<Clasp::Constraint>
                          (in_stack_ffffffffffffff30,(Constraint **)in_stack_ffffffffffffff28);
      }
      if ((bool)uVar7 != false) {
        in_stack_ffffffffffffff40.set = (ConstraintSet *)local_48;
        bk_lib::detail::left_right_rep<Clasp::ClauseWatch,_Clasp::GenericWatch>::right_begin
                  ((left_right_rep<Clasp::ClauseWatch,_Clasp::GenericWatch> *)
                   in_stack_ffffffffffffff28);
        bk_lib::detail::left_right_rep<Clasp::ClauseWatch,_Clasp::GenericWatch>::right_end
                  ((left_right_rep<Clasp::ClauseWatch,_Clasp::GenericWatch> *)
                   in_stack_ffffffffffffff18);
        local_78 = local_20;
        std::
        remove_if<std::reverse_iterator<Clasp::GenericWatch*>,Clasp::(anonymous_namespace)::InSet>
                  (in_stack_ffffffffffffff50,
                   (reverse_iterator<Clasp::GenericWatch_*> *)
                   CONCAT17(uVar7,in_stack_ffffffffffffff48),in_stack_ffffffffffffff58);
        bk_lib::detail::left_right_rep<Clasp::ClauseWatch,_Clasp::GenericWatch>::shrink_right
                  ((left_right_rep<Clasp::ClauseWatch,_Clasp::GenericWatch> *)
                   in_stack_ffffffffffffff40.set,
                   (right_iterator *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
      }
    }
  }
  local_80 = (left_right_rep<Clasp::Literal,_unsigned_int> *)0x0;
  bk_lib::detail::left_right_rep<Clasp::Literal,_unsigned_int>::right_begin
            (in_stack_ffffffffffffff28);
  bk_lib::detail::left_right_rep<Clasp::Literal,_unsigned_int>::right_end(in_stack_ffffffffffffff18)
  ;
  while (bVar1 = std::operator!=((reverse_iterator<unsigned_int_*> *)in_stack_ffffffffffffff20,
                                 (reverse_iterator<unsigned_int_*> *)in_stack_ffffffffffffff18),
        bVar1) {
    puVar4 = std::reverse_iterator<unsigned_int_*>::operator*(&local_88);
    uVar6 = *puVar4;
    sVar3 = bk_lib::pod_vector<Clasp::Solver::DLevel,_std::allocator<Clasp::Solver::DLevel>_>::size
                      ((pod_vector<Clasp::Solver::DLevel,_std::allocator<Clasp::Solver::DLevel>_> *)
                       local_18);
    if (uVar6 < sVar3) {
      this_00 = local_18;
      puVar4 = std::reverse_iterator<unsigned_int_*>::operator*(&local_88);
      pDVar5 = bk_lib::pod_vector<Clasp::Solver::DLevel,_std::allocator<Clasp::Solver::DLevel>_>::
               operator[]((pod_vector<Clasp::Solver::DLevel,_std::allocator<Clasp::Solver::DLevel>_>
                           *)this_00,*puVar4);
      local_80 = (left_right_rep<Clasp::Literal,_unsigned_int> *)pDVar5->undo;
      bVar1 = bk_lib::pod_vector<Clasp::Constraint_*,_std::allocator<Clasp::Constraint_*>_>::empty
                        ((pod_vector<Clasp::Constraint_*,_std::allocator<Clasp::Constraint_*>_> *)
                         local_80);
      if (!bVar1) {
        bk_lib::pod_vector<Clasp::Constraint_*,_std::allocator<Clasp::Constraint_*>_>::begin
                  ((pod_vector<Clasp::Constraint_*,_std::allocator<Clasp::Constraint_*>_> *)local_80
                  );
        bVar1 = test_and_clear<Clasp::Constraint>(this_00,(Constraint **)in_stack_ffffffffffffff28);
        if (bVar1) {
          in_stack_ffffffffffffff20 = local_80;
          in_stack_ffffffffffffff18 =
               (left_right_rep<Clasp::Literal,_unsigned_int> *)
               bk_lib::pod_vector<Clasp::Constraint_*,_std::allocator<Clasp::Constraint_*>_>::begin
                         ((pod_vector<Clasp::Constraint_*,_std::allocator<Clasp::Constraint_*>_> *)
                          local_80);
          bk_lib::pod_vector<Clasp::Constraint_*,_std::allocator<Clasp::Constraint_*>_>::end
                    ((pod_vector<Clasp::Constraint_*,_std::allocator<Clasp::Constraint_*>_> *)
                     local_80);
          in_stack_ffffffffffffff28 =
               (left_right_rep<Clasp::Literal,_unsigned_int> *)
               std::remove_if<Clasp::Constraint**,Clasp::(anonymous_namespace)::InSet>
                         ((Constraint **)CONCAT44(uVar6,in_stack_ffffffffffffff38),
                          (Constraint **)this_00,in_stack_ffffffffffffff40);
          bk_lib::pod_vector<Clasp::Constraint_*,_std::allocator<Clasp::Constraint_*>_>::end
                    ((pod_vector<Clasp::Constraint_*,_std::allocator<Clasp::Constraint_*>_> *)
                     local_80);
          bk_lib::pod_vector<Clasp::Constraint_*,_std::allocator<Clasp::Constraint_*>_>::erase
                    ((pod_vector<Clasp::Constraint_*,_std::allocator<Clasp::Constraint_*>_> *)
                     in_stack_ffffffffffffff40.set,
                     (iterator)CONCAT44(uVar6,in_stack_ffffffffffffff38),(iterator)this_00);
        }
      }
    }
    std::reverse_iterator<unsigned_int_*>::operator++(&local_88);
  }
  bk_lib::detail::left_right_rep<Clasp::Literal,_unsigned_int>::clear
            (in_stack_ffffffffffffff20,SUB81((ulong)in_stack_ffffffffffffff18 >> 0x38,0));
  std::
  unordered_set<Clasp::Constraint_*,_std::hash<Clasp::Constraint_*>,_std::equal_to<Clasp::Constraint_*>,_std::allocator<Clasp::Constraint_*>_>
  ::clear((unordered_set<Clasp::Constraint_*,_std::hash<Clasp::Constraint_*>,_std::equal_to<Clasp::Constraint_*>,_std::allocator<Clasp::Constraint_*>_>
           *)0x1f3327);
  this->last = (Constraint *)0x0;
  return;
}

Assistant:

void cleanup(Watches& watches, DecisionLevels& levels) {
		InSet inCons = { &cons };
		const uint32 maxId = (uint32)watches.size();
		for (DirtyList::left_iterator it = dirty.left_begin(), end = dirty.left_end(); it != end; ++it) {
			uint32 id = it->id();
			if (id >= maxId)
				continue;
			WatchList& wl = watches[id];
			if (wl.left_size() && test_and_clear(wl.left_begin()->head)) { wl.shrink_left(std::remove_if(wl.left_begin(), wl.left_end(), inCons)); }
			if (wl.right_size()&& test_and_clear(wl.right_begin()->con)) { wl.shrink_right(std::remove_if(wl.right_begin(), wl.right_end(), inCons)); }
		}
		ConstraintDB* db = 0;
		for (DirtyList::right_iterator it = dirty.right_begin(), end = dirty.right_end(); it != end; ++it) {
			if (*it < levels.size() && !(db = levels[*it].undo)->empty() && test_and_clear(*db->begin())) {
				db->erase(std::remove_if(db->begin(), db->end(), inCons), db->end());
			}
		}
		dirty.clear();
		cons.clear();
		last = 0;
	}